

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getMemorySize
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name memory)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true> local_38;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true> local_30;
  iterator iter;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  this_local = memory.super_IString.str._M_len;
  iter.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
       ::find(&this->memorySizes,(key_type *)&this_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
       ::end(&this->memorySizes);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"getMemorySize called on non-existing memory");
  }
  ppVar2 = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Address>,_false,_true>::
           operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Address>,_false,_true> *)
                      &local_30);
  return (Address)(ppVar2->second).addr;
}

Assistant:

Address getMemorySize(Name memory) {
    auto iter = memorySizes.find(memory);
    if (iter == memorySizes.end()) {
      externalInterface->trap("getMemorySize called on non-existing memory");
    }
    return iter->second;
  }